

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall libtorrent::aux::bt_peer_connection::write_bitfield(bt_peer_connection *this)

{
  ulong uVar1;
  byte *pbVar2;
  pointer psVar3;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  counters *this_01;
  ulong uVar4;
  undefined8 uVar5;
  int64_t value;
  undefined1 auVar6 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  byte *pbVar12;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *ptVar13;
  byte *pbVar14;
  undefined1 *puVar15;
  size_t k;
  pointer psVar16;
  char *pcVar17;
  piece_index_t pVar18;
  uint uVar19;
  span<const_char> buf;
  undefined1 local_98 [8];
  string bitfield_string;
  byte *local_60;
  char *ptr;
  ulong local_50;
  undefined1 local_48 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  
  pbVar14 = local_98;
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_98,
             &(this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_48,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_98);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&bitfield_string);
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if ((*(undefined1 *)((long)local_48 + 0x5cc) & 8) != 0) {
    peer_connection::peer_log
              (&this->super_peer_connection,info,"BITFIELD","not sending bitfield, super seeding");
    bVar8 = (this->super_peer_connection).field_0x889;
    if ((bVar8 & 4) != 0) {
      write_have_none(this);
      bVar8 = *(byte *)((long)&t.
                               super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi[0x88]._M_use_count + 1);
      this = (bt_peer_connection *)
             t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    }
    auVar6 = local_48;
    (this->super_peer_connection).field_0x889 = bVar8 | 8;
    ptVar13 = peer_connection::get_bitfield(&this->super_peer_connection);
    pVar18 = torrent::get_piece_to_super_seed((torrent *)auVar6,ptVar13);
    if (-1 < pVar18.m_val) {
      peer_connection::superseed_piece
                ((peer_connection *)
                 t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi,(piece_index_t)0xffffffff,pVar18);
    }
    ptVar13 = peer_connection::get_bitfield
                        ((peer_connection *)
                         t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
    pVar18 = torrent::get_piece_to_super_seed((torrent *)local_48,ptVar13);
    puVar15 = local_98;
    if (-1 < pVar18.m_val) {
      peer_connection::superseed_piece
                ((peer_connection *)
                 t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi,(piece_index_t)0xffffffff,pVar18);
      puVar15 = local_98;
    }
    goto LAB_00189aa9;
  }
  if (((this->super_peer_connection).field_0x889 & 4) != 0) {
    bVar9 = torrent::is_seed((torrent *)local_48);
    if (bVar9) {
      write_have_all((bt_peer_connection *)
                     t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
      puVar15 = local_98;
      goto LAB_00189aa9;
    }
    if (((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[0x88]._M_use_count & 0x400) != 0) &&
       (iVar10 = torrent::num_have((torrent *)local_48), iVar10 == 0)) {
      write_have_none((bt_peer_connection *)
                      t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
      puVar15 = local_98;
      goto LAB_00189aa9;
    }
  }
  iVar10 = torrent::num_have((torrent *)local_48);
  _Var7 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (iVar10 == 0) {
    peer_connection::peer_log
              ((peer_connection *)
               t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi,info,"BITFIELD","not sending bitfield, have none");
    pbVar14 = (byte *)((long)&_Var7._M_pi[0x88]._M_use_count + 1);
    *pbVar14 = *pbVar14 | 8;
    puVar15 = local_98;
    goto LAB_00189aa9;
  }
  iVar10 = (((((torrent_hot_members *)((long)local_48 + 8))->m_torrent_file).
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_files).m_num_pieces;
  ptr = (char *)(long)iVar10;
  uVar4 = (long)(iVar10 + 7) / 8;
  iVar11 = (int)uVar4;
  uVar1 = (long)iVar11 + 5;
  if ((long)ptr < 0x7fd9) {
    if (-0x2f < iVar10) {
      pbVar14 = local_98 + -((uVar1 & 0xffffffff) + 0xf & 0xfffffffffffffff0);
      pbVar12 = pbVar14;
      local_50 = uVar1;
      goto LAB_001898c9;
    }
    bitfield_string.field_2._8_8_ = 0;
  }
  else {
    local_50 = uVar1;
    pbVar12 = (byte *)operator_new__(uVar1);
    pbVar14 = local_98;
LAB_001898c9:
    bitfield_string.field_2._8_8_ = pbVar12;
    local_60 = pbVar12;
    pbVar14[-8] = 0xe8;
    pbVar14[-7] = 0x98;
    pbVar14[-6] = 0x18;
    pbVar14[-5] = 0;
    pbVar14[-4] = 0;
    pbVar14[-3] = 0;
    pbVar14[-2] = 0;
    pbVar14[-1] = 0;
    write_impl<int,int,char*>(iVar11 + 1,(char **)&local_60);
    *local_60 = 5;
    auVar6 = local_48;
    local_60 = local_60 + 1;
    pbVar14[-8] = 0xfa;
    pbVar14[-7] = 0x98;
    pbVar14[-6] = 0x18;
    pbVar14[-5] = 0;
    pbVar14[-4] = 0;
    pbVar14[-3] = 0;
    pbVar14[-2] = 0;
    pbVar14[-1] = 0;
    bVar9 = torrent::is_seed((torrent *)auVar6);
    pbVar2 = local_60;
    if (bVar9) {
      local_98[0] = 0xff;
      pbVar14[-8] = 0x18;
      pbVar14[-7] = 0x99;
      pbVar14[-6] = 0x18;
      pbVar14[-5] = 0;
      pbVar14[-4] = 0;
      pbVar14[-3] = 0;
      pbVar14[-2] = 0;
      pbVar14[-1] = 0;
      ::std::__fill_n_a<char*,int,unsigned_char>(pbVar2,uVar4 & 0xffffffff);
      (pbVar12 + -1)[local_50] = (byte)(0xff << (-(char)ptr & 7U));
    }
    else {
      pVar18.m_val = 0;
      pbVar14[-8] = 0xe7;
      pbVar14[-7] = 0x99;
      pbVar14[-6] = 0x18;
      pbVar14[-5] = 0;
      pbVar14[-4] = 0;
      pbVar14[-3] = 0;
      pbVar14[-2] = 0;
      pbVar14[-1] = 0;
      memset(pbVar2,0,(long)iVar11);
      this_00._M_head_impl =
           (((torrent_hot_members *)((long)local_48 + 8))->m_picker)._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
      iVar10 = 0;
      if (0 < (int)ptr) {
        iVar10 = (int)ptr;
      }
      uVar19 = 0x80;
      for (; iVar10 != pVar18.m_val; pVar18.m_val = pVar18.m_val + 1) {
        pbVar14[-8] = 0x17;
        pbVar14[-7] = 0x9a;
        pbVar14[-6] = 0x18;
        pbVar14[-5] = 0;
        pbVar14[-4] = 0;
        pbVar14[-3] = 0;
        pbVar14[-2] = 0;
        pbVar14[-1] = 0;
        bVar9 = piece_picker::have_piece(this_00._M_head_impl,pVar18);
        if (bVar9) {
          *local_60 = *local_60 | (byte)uVar19;
        }
        if (uVar19 < 2) {
          local_60 = local_60 + 1;
          uVar19 = 0x80;
        }
        else {
          uVar19 = (int)uVar19 >> 1;
        }
      }
    }
    psVar3 = (((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                *)((long)local_48 + 0x3e0))->
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar16 = (((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                      *)((long)local_48 + 0x3e0))->
                   super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; psVar16 != psVar3;
        psVar16 = psVar16 + 1) {
      iVar10 = psVar16->m_val;
      pbVar14[-8] = 8;
      pbVar14[-7] = 0;
      pbVar14[-6] = 0;
      pbVar14[-5] = 0;
      pbVar14[-4] = 0;
      pbVar14[-3] = 0;
      pbVar14[-2] = 0;
      pbVar14[-1] = 0;
      pbVar12[(long)(iVar10 / (int)*(undefined8 *)(pbVar14 + -8)) + 5] =
           pbVar12[(long)(iVar10 / (int)*(undefined8 *)(pbVar14 + -8)) + 5] |
           (byte)(0x80 >> ((byte)iVar10 & 7));
    }
    pbVar14[-8] = 1;
    _Var7 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    pbVar14[-7] = 0;
    pbVar14[-6] = 0;
    pbVar14[-5] = 0;
    pbVar14[-4] = 0;
    pbVar14[-3] = 0;
    pbVar14[-2] = 0;
    pbVar14[-1] = 0;
    uVar5 = *(undefined8 *)(pbVar14 + -8);
    pbVar14[-8] = 0x79;
    pbVar14[-7] = 0x99;
    pbVar14[-6] = 0x18;
    pbVar14[-5] = 0;
    pbVar14[-4] = 0;
    pbVar14[-3] = 0;
    pbVar14[-2] = 0;
    pbVar14[-1] = 0;
    bVar9 = peer_connection::should_log((peer_connection *)_Var7._M_pi,(direction_t)uVar5);
    if (bVar9) {
      local_98 = (undefined1  [8])&bitfield_string._M_string_length;
      bitfield_string._M_dataplus._M_p = (pointer)0x0;
      bitfield_string._M_string_length._0_1_ = 0;
      pbVar14[-8] = 0xa1;
      pbVar14[-7] = 0x99;
      pbVar14[-6] = 0x18;
      pbVar14[-5] = 0;
      pbVar14[-4] = 0;
      pbVar14[-3] = 0;
      pbVar14[-2] = 0;
      pbVar14[-1] = 0;
      ::std::__cxx11::string::resize((ulong)local_98);
      for (pcVar17 = (char *)0x0; auVar6 = local_98, ptr != pcVar17; pcVar17 = pcVar17 + 1) {
        pbVar14[-8] = 8;
        pbVar14[-7] = 0;
        pbVar14[-6] = 0;
        pbVar14[-5] = 0;
        pbVar14[-4] = 0;
        pbVar14[-3] = 0;
        pbVar14[-2] = 0;
        pbVar14[-1] = 0;
        pcVar17[(long)((peer_class_set *)((long)local_98 + 0x60) + -2) + 0x20] =
             (byte)~(pbVar12[(long)(int)((long)((ulong)(uint)((int)pcVar17 >> 0x1f) << 0x20 |
                                               (ulong)pcVar17 & 0xffffffff) /
                                        (long)(int)*(undefined8 *)(pbVar14 + -8)) + 5] <<
                    ((byte)pcVar17 & 7)) >> 7 ^ 0x31;
      }
      pbVar14[-8] = 1;
      _Var7 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ;
      pbVar14[-7] = 0;
      pbVar14[-6] = 0;
      pbVar14[-5] = 0;
      pbVar14[-4] = 0;
      pbVar14[-3] = 0;
      pbVar14[-2] = 0;
      pbVar14[-1] = 0;
      uVar5 = *(undefined8 *)(pbVar14 + -8);
      pbVar14[-8] = 0x62;
      pbVar14[-7] = 0x9a;
      pbVar14[-6] = 0x18;
      pbVar14[-5] = 0;
      pbVar14[-4] = 0;
      pbVar14[-3] = 0;
      pbVar14[-2] = 0;
      pbVar14[-1] = 0;
      peer_connection::peer_log
                ((peer_connection *)_Var7._M_pi,(direction_t)uVar5,"BITFIELD","%s",auVar6);
      pbVar14[-8] = 0x6a;
      pbVar14[-7] = 0x9a;
      pbVar14[-6] = 0x18;
      pbVar14[-5] = 0;
      pbVar14[-4] = 0;
      pbVar14[-3] = 0;
      pbVar14[-2] = 0;
      pbVar14[-1] = 0;
      ::std::__cxx11::string::~string((string *)local_98);
    }
    _Var7._M_pi = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    uVar1 = local_50;
    pbVar2 = (byte *)((long)&t.
                             super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi[0x88]._M_use_count + 1);
    *pbVar2 = *pbVar2 | 8;
    pbVar14[-8] = 0x81;
    pbVar14[-7] = 0x9a;
    pbVar14[-6] = 0x18;
    pbVar14[-5] = 0;
    pbVar14[-4] = 0;
    pbVar14[-3] = 0;
    pbVar14[-2] = 0;
    pbVar14[-1] = 0;
    buf.m_len = uVar1;
    buf.m_ptr = (char *)pbVar12;
    peer_connection::send_buffer((peer_connection *)_Var7._M_pi,buf);
    this_01 = *(counters **)
               &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[0x24]._M_use_count;
    pbVar14[-8] = 0x5a;
    pbVar14[-7] = 0;
    pbVar14[-6] = 0;
    pbVar14[-5] = 0;
    pbVar14[-4] = 0;
    pbVar14[-3] = 0;
    pbVar14[-2] = 0;
    pbVar14[-1] = 0;
    uVar5 = *(undefined8 *)(pbVar14 + -8);
    pbVar14[-8] = 1;
    pbVar14[-7] = 0;
    pbVar14[-6] = 0;
    pbVar14[-5] = 0;
    pbVar14[-4] = 0;
    pbVar14[-3] = 0;
    pbVar14[-2] = 0;
    pbVar14[-1] = 0;
    value = *(int64_t *)(pbVar14 + -8);
    pbVar14[-8] = 0x97;
    pbVar14[-7] = 0x9a;
    pbVar14[-6] = 0x18;
    pbVar14[-5] = 0;
    pbVar14[-4] = 0;
    pbVar14[-3] = 0;
    pbVar14[-2] = 0;
    pbVar14[-1] = 0;
    counters::inc_stats_counter(this_01,(int)uVar5,value);
  }
  *(undefined8 *)(pbVar14 + -8) = 0x189aa9;
  alloca_destructor<char>::~alloca_destructor
            ((alloca_destructor<char> *)((long)&bitfield_string.field_2 + 8));
  puVar15 = pbVar14;
LAB_00189aa9:
  *(undefined8 *)(puVar15 + -8) = 0x189ab2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t);
  return;
}

Assistant:

void bt_peer_connection::write_bitfield()
	{
		INVARIANT_CHECK;

		// if we have not received the other peer's extension bits yet, how do we
		// know whether to send a have-all or have-none?
		TORRENT_ASSERT(m_state >= state_t::read_peer_id);

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);
		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(t->valid_metadata());

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding())
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, super seeding");
#endif
			if (m_supports_fast) write_have_none();

			// if we are super seeding, pretend to not have any piece
			// and don't send a bitfield
			m_sent_bitfield = true;

			// bootstrap super-seeding by sending two have message
			piece_index_t piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			return;
		}
		else
#endif
			if (m_supports_fast && t->is_seed())
		{
			write_have_all();
			return;
		}
		else if (m_supports_fast && t->num_have() == 0)
		{
			write_have_none();
			return;
		}
		else if (t->num_have() == 0)
		{
			// don't send a bitfield if we don't have any pieces
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, have none");
#endif
			m_sent_bitfield = true;
			return;
		}

		const int num_pieces = t->torrent_file().num_pieces();
		TORRENT_ASSERT(num_pieces > 0);

		constexpr std::uint8_t char_bit_mask = CHAR_BIT - 1;
		constexpr std::uint8_t char_top_bit = 1 << (CHAR_BIT - 1);

		const int packet_size = (num_pieces + char_bit_mask) / CHAR_BIT + 5;

		TORRENT_ALLOCA(msg, char, packet_size);
		if (msg.data() == nullptr) return; // out of memory
		auto ptr = msg.begin();

		aux::write_int32(packet_size - 4, ptr);
		aux::write_uint8(msg_bitfield, ptr);

		if (t->is_seed())
		{
			std::fill_n(ptr, packet_size - 5, std::uint8_t{0xff});

			// Clear trailing bits
			msg.back() = static_cast<char>((0xff << ((CHAR_BIT - (num_pieces & char_bit_mask)) & char_bit_mask)) & 0xff);
		}
		else
		{
			std::memset(ptr, 0, aux::numeric_cast<std::size_t>(packet_size - 5));
			piece_picker const& p = t->picker();
			int mask = char_top_bit;
			for (piece_index_t i(0); i < piece_index_t(num_pieces); ++i)
			{
				if (p.have_piece(i)) *ptr |= mask;
				mask >>= 1;
				if (mask == 0)
				{
					mask = char_top_bit;
					++ptr;
				}
			}
		}

#ifndef TORRENT_DISABLE_PREDICTIVE_PIECES
		// add predictive pieces to the bitfield as well, since we won't
		// announce them again
		for (piece_index_t const p : t->predictive_pieces())
			msg[5 + static_cast<int>(p) / CHAR_BIT] |= (char_top_bit >> (static_cast<int>(p) & char_bit_mask));
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			std::string bitfield_string;
			auto const n_pieces = aux::numeric_cast<std::size_t>(num_pieces);
			bitfield_string.resize(n_pieces);
			for (std::size_t k = 0; k < n_pieces; ++k)
			{
				if (msg[5 + int(k) / CHAR_BIT] & (char_top_bit >> (k % CHAR_BIT))) bitfield_string[k] = '1';
				else bitfield_string[k] = '0';
			}
			peer_log(peer_log_alert::outgoing_message, "BITFIELD"
				, "%s", bitfield_string.c_str());
		}
#endif
		m_sent_bitfield = true;

		send_buffer(msg);

		stats_counters().inc_stats_counter(counters::num_outgoing_bitfield);
	}